

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char *__s;
  ulong uVar4;
  CharFormat CVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  CVar5 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar5 == kAsIs) || (FLAGS_gtest_print_utf8 != '\x01')) {
    return;
  }
  __s = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  if (uVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      goto LAB_004aeeee;
    }
  }
  else {
    bVar10 = true;
    uVar9 = 1;
    do {
      bVar2 = __s[uVar9 - 1];
      iVar6 = iscntrl((uint)bVar2);
      if ((iVar6 != 0) && ((0xd < bVar2 || ((0x2600U >> (bVar2 & 0x1f) & 1) == 0)))) break;
      bVar10 = uVar9 < uVar4;
      bVar11 = uVar9 != uVar4;
      uVar9 = uVar9 + 1;
    } while (bVar11);
    if (bVar10) {
      return;
    }
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      bVar2 = __s[uVar9];
      uVar7 = uVar1;
      if ((char)bVar2 < '\0') {
        if (bVar2 < 0xc2) {
          return;
        }
        if (((0xdf < bVar2) || (uVar4 < uVar9 + 2)) || (uVar7 = uVar9 + 2, -0x41 < __s[uVar1])) {
          if ((bVar2 & 0xf0) == 0xe0) {
            uVar7 = uVar9 + 3;
            if (uVar4 < uVar7) {
              return;
            }
            bVar3 = __s[uVar1];
            if (-0x41 < (char)bVar3) {
              return;
            }
            if (-0x41 < __s[uVar9 + 2]) {
              return;
            }
            if (bVar2 == 0xed) {
              if (0x9f < bVar3) {
                return;
              }
            }
            else if ((bVar2 == 0xe0) && (bVar3 < 0xa0)) {
              return;
            }
          }
          else {
            if (4 < (byte)(bVar2 + 0x10)) {
              return;
            }
            uVar7 = uVar9 + 4;
            if (uVar4 < uVar7) {
              return;
            }
            bVar3 = __s[uVar1];
            if (-0x41 < (char)bVar3) {
              return;
            }
            if (-0x41 < __s[uVar9 + 2]) {
              return;
            }
            if (-0x41 < __s[uVar9 + 3]) {
              return;
            }
            if (bVar2 == 0xf4) {
              if (0x8f < bVar3) {
                return;
              }
            }
            else if ((bVar2 == 0xf0) && (bVar3 < 0x90)) {
              return;
            }
          }
        }
      }
      uVar9 = uVar7;
    } while (uVar7 < uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
  }
  sVar8 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar8);
LAB_004aeeee:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}